

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_can_pbuf.c
# Opt level: O3

csp_packet_t *
csp_can_pbuf_find(csp_can_interface_data_t *ifdata,uint32_t id,uint32_t mask,int *task_woken)

{
  uint32_t uVar1;
  csp_packet_t *pcVar2;
  
  pcVar2 = ifdata->pbufs;
  while( true ) {
    if (pcVar2 == (csp_packet_t *)0x0) {
      return (csp_packet_t *)0x0;
    }
    if ((((pcVar2->field_0).field_0.timestamp_rx ^ id) & mask) == 0) break;
    pcVar2 = pcVar2->next;
  }
  if (task_woken == (int *)0x0) {
    uVar1 = csp_get_ms();
  }
  else {
    uVar1 = csp_get_ms_isr();
  }
  (pcVar2->field_0).field_1.last_used = uVar1;
  return pcVar2;
}

Assistant:

csp_packet_t * csp_can_pbuf_find(csp_can_interface_data_t * ifdata, uint32_t id, uint32_t mask, int * task_woken) {

	csp_packet_t * packet = ifdata->pbufs;
	while (packet) {

		if ((packet->cfpid & mask) == (id & mask)) {
			packet->last_used = (task_woken) ? csp_get_ms_isr() : csp_get_ms();
			return packet;
		}
		packet = packet->next;
	}

	return NULL;

}